

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O0

void JitFFI::OpCode_x64::movlps(JitFuncCreater *jfc,Register dst,Register src)

{
  bool bVar1;
  byte bVar2;
  bool local_19;
  Register src_local;
  Register dst_local;
  JitFuncCreater *jfc_local;
  
  bVar1 = is_xmmx(dst);
  local_19 = false;
  if (bVar1) {
    local_19 = is_prx(src);
  }
  if (local_19 != false) {
    bVar2 = _get_mov_head(src,dst);
    if (bVar2 != '\0') {
      bVar2 = _get_mov_head_rpxd(src,dst);
      JitFuncCreater::push(jfc,bVar2);
    }
    JitFuncCreater::push(jfc,'\x0f','\x12');
    mov_rx_prx_base(jfc,dst,src);
    return;
  }
  __assert_fail("is_xmmx(dst) && is_prx(src)",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                ,0x1a4,"void JitFFI::OpCode_x64::movlps(JitFuncCreater &, Register, Register)");
}

Assistant:

inline void movlps(JitFuncCreater &jfc, Register dst, Register src) {
			// movlps XMM, m64
			assert(is_xmmx(dst) && is_prx(src));
			if (_get_mov_head(src, dst) != 0)
				jfc.push(_get_mov_head_rpxd(src, dst));
			jfc.push(0x0f, 0x12);
			mov_rx_prx_base(jfc, dst, src);
		}